

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxapp.h
# Opt level: O2

void __thiscall
ktxApp::processCommandLine
          (ktxApp *this,int argc,char **argv,StdinUse stdinStat,OutfilePos outfilePos)

{
  string *psVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  value_type *__x;
  char cVar7;
  commandOptions *pcVar8;
  const_iterator it;
  pointer pbVar9;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  argparser parser;
  
  psVar1 = &this->name;
  std::__cxx11::string::assign((char *)psVar1);
  cVar7 = (char)psVar1;
  lVar5 = std::__cxx11::string::rfind(cVar7,0x5c);
  if ((lVar5 != -1) || (lVar5 = std::__cxx11::string::rfind(cVar7,0x2f), lVar5 != -1)) {
    std::__cxx11::string::erase((ulong)psVar1,0);
  }
  uVar6 = std::__cxx11::string::rfind(cVar7,0x2e);
  if (uVar6 != 0xffffffffffffffff) {
    std::__cxx11::string::erase((ulong)psVar1,uVar6);
  }
  argparser::argparser(&parser,argc,argv);
  (*this->_vptr_ktxApp[2])(this,&parser);
  if (parser.optind != argc) {
    if (outfilePos == eFirst) {
      std::__cxx11::string::_M_assign((string *)&this->options->outfile);
      parser.optind = parser.optind + 1;
    }
    uVar6 = (ulong)parser.optind;
    lVar5 = uVar6 << 5;
    for (; uVar6 < argc - (uint)(outfilePos == eLast); uVar6 = uVar6 + 1) {
      pcVar2 = *(char **)((long)&((parser.argv.
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar5);
      __x = (value_type *)
            ((long)&((parser.argv.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5);
      if (*pcVar2 == '@') {
        bVar3 = loadFileList(this,__x,pcVar2[1] == '@',&this->options->infiles);
        if (!bVar3) goto LAB_001065ce;
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->options->infiles,__x);
      }
      lVar5 = lVar5 + 0x20;
    }
    pcVar8 = this->options;
    pbVar9 = (pcVar8->infiles).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (0x20 < (ulong)((long)(pcVar8->infiles).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9)) {
      do {
        pcVar8 = this->options;
        if ((pcVar8->infiles).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish <= pbVar9) goto LAB_001065d6;
        iVar4 = std::__cxx11::string::compare((char *)pbVar9);
        pbVar9 = pbVar9 + 1;
      } while (iVar4 != 0);
      error(this,"cannot use stdin as one among many inputs.");
      (*this->_vptr_ktxApp[1])(this);
      goto LAB_001065ce;
    }
LAB_001065d6:
    if (outfilePos == eLast) {
      std::__cxx11::string::_M_assign((string *)&pcVar8->outfile);
    }
  }
  pcVar8 = this->options;
  if ((pcVar8->infiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pcVar8->infiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    if (stdinStat != eAllowStdin) {
      error(this,"need some input files.");
      (*this->_vptr_ktxApp[1])(this);
LAB_001065ce:
      exit(1);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"-",&local_91);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pcVar8,&local_90
              );
    std::__cxx11::string::~string((string *)&local_90);
  }
  if ((outfilePos != eNone) && ((this->options->outfile)._M_string_length == 0)) {
    error(this,"need an output file");
  }
  argparser::~argparser(&parser);
  return;
}

Assistant:

void processCommandLine(int argc, char* argv[],
                            StdinUse stdinStat = eAllowStdin,
                            OutfilePos outfilePos = eNone)
    {
        uint32_t i;
        size_t slash, dot;

        name = argv[0];
        // For consistent Id, only use the stem of name;
        slash = name.find_last_of('\\');
        if (slash == string::npos)
            slash = name.find_last_of('/');
        if (slash != string::npos)
            name.erase(0, slash+1);  // Remove directory name.
        dot = name.find_last_of('.');
            if (dot != string::npos)
                name.erase(dot, string::npos); // Remove extension.

        argparser parser(argc, argv);
        processOptions(parser);

        i = parser.optind;
        if (argc - i > 0) {
            if (outfilePos == eFirst)
                options.outfile = parser.argv[i++];
            uint32_t infileCount = outfilePos == eLast ? argc - 1 : argc;
            for (; i < infileCount; i++) {
                if (parser.argv[i][0] == '@') {
                    if (!loadFileList(parser.argv[i],
                                      parser.argv[i][1] == '@',
                                      options.infiles)) {
                        exit(1);
                    }
                } else {
                    options.infiles.push_back(parser.argv[i]);
                }
            }
            if (options.infiles.size() > 1) {
                std::vector<string>::const_iterator it;
                for (it = options.infiles.begin(); it < options.infiles.end(); it++) {
                    if (it->compare("-") == 0) {
                        error("cannot use stdin as one among many inputs.");
                        usage();
                        exit(1);
                    }
                }
            }
            if (outfilePos == eLast)
                options.outfile = parser.argv[i];
        }

        if (options.infiles.size() == 0) {
            if (stdinStat == eAllowStdin) {
                options.infiles.push_back("-"); // Use stdin as 0 files.
            } else {
                error("need some input files.");
                usage();
                exit(1);
            }
        }
        if (outfilePos != eNone && options.outfile.empty()) {
            error("need an output file");
        }
    }